

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxStateByIndex::Resolve(FxStateByIndex *this,FCompileContext *ctx)

{
  PInt *pPVar1;
  int iVar2;
  PClassActor *pPVar3;
  FxStateByIndex *pFVar4;
  
  pFVar4 = this;
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (ctx->Class == (PStruct *)0x0) {
      pFVar4 = (FxStateByIndex *)0x0;
    }
    else {
      pPVar3 = dyn_cast<PClassActor>((DObject *)ctx->Class);
      if ((pPVar3 == (PClassActor *)0x0) || (pPVar3->NumOwnedStates < 1)) {
        __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x25f6,"virtual FxExpression *FxStateByIndex::Resolve(FCompileContext &)");
      }
      if (this->index < pPVar3->NumOwnedStates) {
        iVar2 = FStateLabelStorage::AddPointer(&StateLabels,pPVar3->OwnedStates + this->index);
        pFVar4 = (FxStateByIndex *)FMemArena::Alloc(&FxAlloc,0x38);
        (pFVar4->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition
                  (&(pFVar4->super_FxExpression).ScriptPosition,
                   &(this->super_FxExpression).ScriptPosition);
        (pFVar4->super_FxExpression).ValueType = (PType *)0x0;
        (pFVar4->super_FxExpression).isresolved = false;
        (pFVar4->super_FxExpression).NeedResult = true;
        (pFVar4->super_FxExpression).ExprType = EFX_Constant;
        (pFVar4->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
        pPVar1 = TypeSInt32;
        *(PInt **)&pFVar4->index = TypeSInt32;
        (pFVar4->super_FxExpression).ValueType = (PType *)pPVar1;
        *(int *)&pFVar4[1].super_FxExpression._vptr_FxExpression = iVar2;
        (pFVar4->super_FxExpression).isresolved = true;
        (pFVar4->super_FxExpression).ValueType = (PType *)TypeStateLabel;
      }
      else {
        pFVar4 = (FxStateByIndex *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "%s: Attempt to jump to non existing state index %d",
                   FName::NameData.NameArray[(ctx->Class->super_PNamedType).TypeName.Index].Text);
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  }
  return &pFVar4->super_FxExpression;
}

Assistant:

FxExpression *FxStateByIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	ABORT(ctx.Class);
	auto aclass = dyn_cast<PClassActor>(ctx.Class);

	// This expression type can only be used from actors, for everything else it has already produced a compile error.
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);

	if (aclass->NumOwnedStates <= index)
	{
		ScriptPosition.Message(MSG_ERROR, "%s: Attempt to jump to non existing state index %d", 
			ctx.Class->TypeName.GetChars(), index);
		delete this;
		return nullptr;
	}
	int symlabel = StateLabels.AddPointer(aclass->OwnedStates + index);
	FxExpression *x = new FxConstant(symlabel, ScriptPosition);
	x->ValueType = TypeStateLabel;
	delete this;
	return x;
}